

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compilation.cpp
# Opt level: O0

parser<pstore::exchange::import_ns::callbacks> *
anon_unknown.dwarf_944bc::import_compilation_parser
          (parser<pstore::exchange::import_ns::callbacks> *__return_storage_ptr__,
          transaction *transaction,string_mapping *names,
          shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
          *fragment_index,digest *digest)

{
  database *this;
  reference_wrapper<const_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
  args_1;
  reference_wrapper<const_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
  args_2;
  parser<pstore::exchange::import_ns::callbacks> *args_3;
  digest *digest_local;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  *fragment_index_local;
  string_mapping *names_local;
  transaction *transaction_local;
  
  args_3 = __return_storage_ptr__;
  this = pstore::transaction_base::db(&transaction->super_transaction_base);
  args_1 = std::
           cref<std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>
                     (fragment_index);
  args_2._M_data =
       (shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
        *)std::cref<pstore::uint128>(digest);
  (anonymous_namespace)::
  make_json_object_parser<pstore::exchange::import_ns::compilation,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*,std::reference_wrapper<std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>const>,std::reference_wrapper<pstore::uint128_const>>
            (args_3,(_anonymous_namespace_ *)this,(database *)transaction,
             (transaction<std::unique_lock<mock_mutex>_> *)names,(string_mapping *)args_1._M_data,
             args_2,(reference_wrapper<const_pstore::uint128>)args_3);
  return __return_storage_ptr__;
}

Assistant:

decltype (auto) import_compilation_parser (
        transaction * const transaction, pstore::exchange::import_ns::string_mapping * const names,
        std::shared_ptr<pstore::index::fragment_index> const & fragment_index,
        pstore::index::digest const & digest) {
        return make_json_object_parser<pstore::exchange::import_ns::compilation> (
            &transaction->db (), transaction, names, std::cref (fragment_index),
            std::cref (digest));
    }